

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc_extension.cpp
# Opt level: O2

uint duckdb_malloc_ncpus(void)

{
  int iVar1;
  
  iVar1 = std::thread::hardware_concurrency();
  return iVar1 + (uint)(iVar1 == 0);
}

Assistant:

unsigned duckdb_malloc_ncpus() {
#ifdef DUCKDB_NO_THREADS
	return 1
#else
	unsigned concurrency = duckdb::NumericCast<unsigned>(std::thread::hardware_concurrency());
	return std::max(concurrency, 1u);
#endif
}